

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setStateFrequencies
          (BeagleCPUImpl<double,_1,_0> *this,int stateFrequenciesIndex,double *inStateFrequencies)

{
  double **ppdVar1;
  int iVar2;
  double *pdVar3;
  
  iVar2 = -5;
  if ((-1 < stateFrequenciesIndex) && (iVar2 = -5, stateFrequenciesIndex < this->kEigenDecompCount))
  {
    ppdVar1 = this->gStateFrequencies;
    if (ppdVar1[(uint)stateFrequenciesIndex] == (double *)0x0) {
      pdVar3 = (double *)malloc((long)this->kStateCount << 3);
      ppdVar1[(uint)stateFrequenciesIndex] = pdVar3;
      if (this->gStateFrequencies[(uint)stateFrequenciesIndex] == (double *)0x0) {
        return -2;
      }
    }
    memcpy(this->gStateFrequencies[(uint)stateFrequenciesIndex],inStateFrequencies,
           (ulong)(uint)this->kStateCount << 3);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setStateFrequencies(int stateFrequenciesIndex,
                                                     const double* inStateFrequencies) {
    if (stateFrequenciesIndex < 0 || stateFrequenciesIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gStateFrequencies[stateFrequenciesIndex] == NULL) {
        gStateFrequencies[stateFrequenciesIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
        if (gStateFrequencies[stateFrequenciesIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gStateFrequencies[stateFrequenciesIndex], inStateFrequencies, kStateCount);

    return BEAGLE_SUCCESS;
}